

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

MAP_RESULT Map_AddOrUpdate(MAP_HANDLE handle,char *key,char *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  char **ppcVar4;
  long lVar5;
  size_t local_98;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  size_t realloc_size;
  size_t valueLength;
  size_t index;
  char *newValue;
  LOGGER_LOG l_1;
  char **whereIsIt;
  MAP_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  MAP_RESULT result;
  char *value_local;
  char *key_local;
  MAP_HANDLE handle_local;
  
  if (((handle == (MAP_HANDLE)0x0) || (key == (char *)0x0)) || (value == (char *)0x0)) {
    l._4_4_ = MAP_INVALIDARG;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar3 = MAP_RESULTStrings(MAP_INVALIDARG);
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/map.c"
                ,"Map_AddOrUpdate",0x193,1,"result = %s%s (%d)","",pcVar3,3);
    }
  }
  else if ((handle->mapFilterCallback == (MAP_FILTER_CALLBACK)0x0) ||
          (iVar1 = (*handle->mapFilterCallback)(key,value), iVar1 == 0)) {
    ppcVar4 = findKey(handle,key);
    if (ppcVar4 == (char **)0x0) {
      iVar1 = insertNewKeyValue(handle,key,value);
      if (iVar1 == 0) {
        l._4_4_ = MAP_OK;
      }
      else {
        l._4_4_ = MAP_ERROR;
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar3 = MAP_RESULTStrings(MAP_ERROR);
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/map.c"
                    ,"Map_AddOrUpdate",0x1a7,1,"result = %s%s (%d)","",pcVar3,2);
        }
      }
    }
    else {
      lVar5 = (long)ppcVar4 - (long)handle->keys >> 3;
      local_98 = strlen(value);
      if (local_98 < 0xfffffffffffffffe) {
        local_98 = local_98 + 1;
      }
      else {
        local_98 = 0xffffffffffffffff;
      }
      if ((local_98 == 0xffffffffffffffff) ||
         (pcVar3 = (char *)realloc(handle->values[lVar5],local_98), pcVar3 == (char *)0x0)) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/map.c"
                    ,"Map_AddOrUpdate",0x1b9,1,"CATASTROPHIC error, unable to realloc, size:%zu",
                    local_98);
        }
        l._4_4_ = MAP_ERROR;
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar3 = MAP_RESULTStrings(MAP_ERROR);
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/map.c"
                    ,"Map_AddOrUpdate",0x1bb,1,"result = %s%s (%d)","",pcVar3,2);
        }
      }
      else {
        memcpy(pcVar3,value,local_98);
        handle->values[lVar5] = pcVar3;
        l._4_4_ = MAP_OK;
      }
    }
  }
  else {
    l._4_4_ = MAP_FILTER_REJECT;
  }
  return l._4_4_;
}

Assistant:

MAP_RESULT Map_AddOrUpdate(MAP_HANDLE handle, const char* key, const char* value)
{
    MAP_RESULT result;
    /*Codes_SRS_MAP_02_013: [If parameter handle is NULL then Map_AddOrUpdate shall return MAP_INVALID_ARG.]*/
    /*Codes_SRS_MAP_02_014: [If parameter key is NULL then Map_AddOrUpdate shall return MAP_INVALID_ARG.]*/
    /*Codes_SRS_MAP_02_015: [If parameter value is NULL then Map_AddOrUpdate shall return MAP_INVALID_ARG.] */
    if (
        (handle == NULL) ||
        (key == NULL) ||
        (value == NULL)
        )
    {
        result = MAP_INVALIDARG;
        LOG_MAP_ERROR;
    }
    else
    {
        MAP_HANDLE_DATA* handleData = (MAP_HANDLE_DATA*)handle;

        /* Codes_SRS_MAP_07_008: [If the mapFilterCallback function is not NULL, then the return value will be check and if it is not zero then Map_AddOrUpdate shall return MAP_FILTER_REJECT.] */
        if (handleData->mapFilterCallback != NULL && handleData->mapFilterCallback(key, value) != 0)
        {
            result = MAP_FILTER_REJECT;
        }
        else
        {
            char** whereIsIt = findKey(handleData, key);
            if (whereIsIt == NULL)
            {
                /*Codes_SRS_MAP_02_017: [Otherwise, Map_AddOrUpdate shall add the pair <key,value> to the map.]*/
                if (insertNewKeyValue(handleData, key, value) != 0)
                {
                    result = MAP_ERROR;
                    LOG_MAP_ERROR;
                }
                else
                {
                    result = MAP_OK;
                }
            }
            else
            {
                /*Codes_SRS_MAP_02_016: [If the key already exists, then Map_AddOrUpdate shall overwrite the value of the existing key with parameter value.]*/
                char* newValue;
                size_t index = whereIsIt - handleData->keys;
                size_t valueLength = strlen(value);
                /*try to realloc value of this key*/
                size_t realloc_size = safe_add_size_t(valueLength, 1);
                if (realloc_size == SIZE_MAX || 
                    (newValue = (char*)realloc(handleData->values[index], realloc_size)) == NULL)
                {
                    LogError("CATASTROPHIC error, unable to realloc, size:%zu", realloc_size);
                    result = MAP_ERROR;
                    LOG_MAP_ERROR;
                }
                else
                {
                    (void)memcpy(newValue, value, realloc_size);
                    handleData->values[index] = newValue;
                    /*Codes_SRS_MAP_02_019: [Otherwise, Map_AddOrUpdate shall return MAP_OK.] */
                    result = MAP_OK;
                }
            }
        }
    }
    return result;
}